

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::CloseStartElement(cmXMLWriter *this)

{
  bool bVar1;
  size_type indent;
  cmXMLWriter *this_local;
  
  if ((this->ElementOpen & 1U) != 0) {
    bVar1 = this->BreakAttrib;
    indent = std::
             stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::size(&this->Elements);
    ConditionalLineBreak(this,(bool)(bVar1 & 1),indent);
    std::operator<<(this->Output,'>');
    this->ElementOpen = false;
  }
  return;
}

Assistant:

void cmXMLWriter::CloseStartElement()
{
  if (this->ElementOpen) {
    this->ConditionalLineBreak(this->BreakAttrib, this->Elements.size());
    this->Output << '>';
    this->ElementOpen = false;
  }
}